

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCancellationTest.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_a34ad::SimpleTask::start(SimpleTask *this,TaskInterface ti)

{
  ulong uVar1;
  long lVar2;
  uintptr_t inputID;
  TaskInterface local_38;
  
  local_38.ctx = ti.ctx;
  local_38.impl = ti.impl;
  uVar1 = (ulong)((long)(this->inputs).
                        super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->inputs).
                       super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  if ((int)uVar1 != 0) {
    lVar2 = 0;
    inputID = 0;
    do {
      llbuild::core::TaskInterface::request
                (&local_38,
                 (KeyType *)
                 ((long)&(((this->inputs).
                           super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>
                           ._M_impl.super__Vector_impl_data._M_start)->key)._M_dataplus._M_p + lVar2
                 ),inputID);
      inputID = inputID + 1;
      lVar2 = lVar2 + 0x20;
    } while ((uVar1 & 0xffffffff) != inputID);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Compute the list of inputs.
    auto inputs = listInputs();

    // Request all of the inputs.
    inputValues.resize(inputs.size());
    for (int i = 0, e = inputs.size(); i != e; ++i) {
      ti.request(inputs[i], i);
    }
  }